

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

bool run_msgpack_example(void)

{
  undefined1 auVar1 [16];
  int iVar2;
  boolean_validator bVar3;
  bool bVar4;
  ostream *poVar5;
  long lVar6;
  ostream *poVar7;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>
  __l;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_27a;
  allocator_type local_279;
  any var2;
  any var;
  undefined1 local_258 [8];
  int local_250;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
  local_248;
  sub_form local_218;
  form form;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
  local_1d8;
  stringstream ss;
  ostream local_198 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  var._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  var._M_storage._M_ptr = (void *)0x0;
  var2._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  var2._M_storage._M_ptr = (void *)0x0;
  local_218.error_._0_1_ = true;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
  ::pair<const_char_(&)[8],_bool,_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
              *)&form,(char (*) [8])"compact",(bool *)&local_218);
  auVar1._12_4_ = 0;
  auVar1._0_12_ = stack0xfffffffffffffdac;
  _local_258 = (sub_form)(auVar1 << 0x20);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
  ::pair<const_char_(&)[7],_int,_true>(&local_1d8,(char (*) [7])"schema",(int *)local_258);
  __l._M_len = 2;
  __l._M_array = (iterator)&form;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
         *)&local_248,__l,&local_27a,&local_279);
  std::any::operator=(&var,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
                            *)&local_248);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
  ::~_Rb_tree(&local_248);
  lVar6 = 0x30;
  do {
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
             *)((long)&form.super_sub_form.error_ + lVar6));
    lVar6 = lVar6 + -0x30;
  } while (lVar6 != -0x30);
  goodform::msgpack::serialize(&var,local_198);
  goodform::msgpack::deserialize((istream *)&ss,&var2);
  goodform::form::form(&form,&var2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_248,"compact",(allocator<char> *)&local_27a);
  _local_258 = goodform::sub_form::at(&form.super_sub_form,(string *)&local_248);
  bVar3 = goodform::sub_form::boolean((sub_form *)local_258);
  local_218.error_._0_1_ = bVar3.value_;
  goodform::boolean_validator::val((boolean_validator *)&local_218);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_248,"schema",(allocator<char> *)&local_27a);
  local_218 = goodform::sub_form::at(&form.super_sub_form,(string *)&local_248);
  goodform::sub_form::int32((sub_form *)local_258);
  iVar2 = local_250;
  std::__cxx11::string::~string((string *)&local_248);
  bVar4 = goodform::form::is_good(&form);
  if (bVar4) {
    poVar7 = (ostream *)&std::cout;
    poVar5 = std::operator<<((ostream *)&std::cout,"{ \"compact\": ");
    *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
         *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) | 1;
    poVar5 = std::ostream::_M_insert<bool>(SUB81(poVar5,0));
    poVar5 = std::operator<<(poVar5,", \"schema\": ");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,iVar2);
    poVar5 = std::operator<<(poVar5," }");
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  else {
    poVar7 = (ostream *)&std::cerr;
  }
  poVar7 = std::operator<<(poVar7,"MsgPack Passed.");
  std::endl<char,std::char_traits<char>>(poVar7);
  std::__cxx11::string::~string((string *)&form.error_);
  std::any::reset(&var2);
  std::any::reset(&var);
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return bVar4;
}

Assistant:

bool run_msgpack_example()
{
  std::stringstream ss;
  goodform::any var, var2;
  var = goodform::object_t
    {
      {"compact", true},
      {"schema", 0}
    };

  goodform::msgpack::serialize(var, ss);
  goodform::msgpack::deserialize(ss, var2);

  goodform::form form(var2);

  struct
  {
    bool compact;
    std::int32_t schema;
  } mpack;

  mpack.compact = form.at("compact").boolean().val();
  mpack.schema = form.at("schema").int32().val();

  if (form.is_good())
  {
    std::cout << "{ \"compact\": " << std::boolalpha << mpack.compact << ", \"schema\": " << mpack.schema << " }" << std::endl;
    std::cout << "MsgPack Passed." << std::endl;
    return true;
  }

  std::cerr << "MsgPack Passed." << std::endl;
  return false;
}